

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O3

void aom_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,int ref_stride,
               int subpel_search)

{
  uint8_t *puVar1;
  buf_2d *pbVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ushort uVar7;
  undefined4 uVar8;
  InterpFilterParams *pIVar9;
  int iVar10;
  long *plVar11;
  long lVar12;
  InterpFilterParams *pIVar13;
  uint uVar14;
  bool bVar15;
  uint8_t auStackY_90b8 [56];
  undefined8 uStackY_9080;
  uint8_t temp [36864];
  
  if (xd != (MACROBLOCKD *)0x0) {
    uVar7 = *(ushort *)&(*xd->mi)->field_0xa7 >> 7;
    temp._204_4_ = uVar7 & 1;
    if ((uVar7 & 1) == 0) {
      temp._168_8_ = xd->block_ref_scale_factors[0];
    }
    else {
      temp._168_8_ = &cm->sf_identity;
    }
    if (((((scale_factors *)temp._168_8_)->x_scale_fp != -1) &&
        (((scale_factors *)temp._168_8_)->y_scale_fp != -1)) &&
       (((scale_factors *)temp._168_8_)->y_scale_fp != 0x4000 ||
        ((scale_factors *)temp._168_8_)->x_scale_fp != 0x4000)) {
      pIVar9 = av1_interp_filter_params_list;
      pIVar13 = av1_interp_filter_params_list;
      if (height < 5) {
        pIVar13 = av1_interp_4tap;
      }
      if ((short)temp._204_4_ != 0) {
        pIVar13 = &av1_intrabc_filter_params;
      }
      if (width < 5) {
        pIVar9 = av1_interp_4tap;
      }
      bVar15 = (short)temp._204_4_ == 0;
      if (!bVar15) {
        pIVar9 = &av1_intrabc_filter_params;
      }
      temp._176_4_ = xd->bd;
      temp._68_4_ = 3;
      if (10 < (int)temp._176_4_) {
        temp._68_4_ = temp._176_4_ + -7;
      }
      temp._72_4_ = 0xb;
      if (10 < (int)temp._176_4_) {
        temp._72_4_ = 0x15 - temp._176_4_;
      }
      temp[0x30] = '\0';
      temp[0x31] = '\0';
      temp[0x32] = '\0';
      temp[0x33] = '\0';
      temp[0x38] = '\0';
      temp[0x39] = '\0';
      temp[0x3a] = '\0';
      temp[0x3b] = '\0';
      temp[0x3c] = '\0';
      temp[0x3d] = '\0';
      temp[0x3e] = '\0';
      temp[0x3f] = '\0';
      temp[0x40] = '\0';
      temp[0x41] = '\0';
      temp[0x42] = '\0';
      temp[0x43] = '\0';
      temp[0x4c] = '\0';
      temp[0x4d] = '\0';
      temp[0x4e] = '\0';
      temp[0x4f] = '\0';
      temp[0x50] = '\0';
      temp[0x51] = '\0';
      temp[0x52] = '\0';
      temp[0x53] = '\0';
      temp[0x54] = '\0';
      temp[0x55] = '\0';
      temp[0x56] = '\0';
      temp[0x57] = '\0';
      temp._160_4_ = xd->plane[0].subsampling_x;
      temp._164_4_ = xd->plane[0].subsampling_y;
      temp._120_4_ = (mi_row << 2) >> ((byte)temp._164_4_ & 0x1f);
      temp._124_4_ = (mi_col << 2) >> ((byte)temp._160_4_ & 0x1f);
      temp._112_4_ = width;
      temp._116_4_ = height;
      temp._180_4_ = (uint)xd->cur_buf->flags >> 3 & 1;
      temp[0] = '\0';
      temp[1] = '\0';
      temp[2] = '\0';
      temp[3] = '\0';
      temp[4] = '\0';
      temp[5] = '\0';
      temp[6] = '\0';
      temp[7] = '\0';
      temp._208_4_ = (0x120U >> ((byte)temp._164_4_ & 0x1f)) * -0x400 + 0x1000;
      temp._212_4_ = (0x120U >> ((byte)temp._160_4_ & 0x1f)) * -0x400 + 0x1000;
      pbVar2 = xd->plane[0].pre + ((ulong)bVar15 - 1);
      temp._128_8_ = pbVar2->buf;
      temp._136_8_ = pbVar2->buf0;
      piVar3 = &xd->plane[0].pre[(ulong)bVar15 - 1].width;
      temp._144_8_ = *(undefined8 *)piVar3;
      temp._152_8_ = *(undefined8 *)(piVar3 + 2);
      temp._96_8_ = pIVar9;
      temp._104_8_ = pIVar13;
      av1_enc_build_one_inter_predictor(comp_pred,width,mv,(InterPredParams *)temp);
      return;
    }
  }
  if (subpel_search - 1U < 3) {
    plVar11 = *(long **)(&DAT_005d1cc0 + (ulong)(subpel_search - 1U) * 8);
  }
  else {
    plVar11 = (long *)0x0;
  }
  if (subpel_y_q3 == 0 && subpel_x_q3 == 0) {
    if (width < 0x10) {
      if (width < 8) {
        if (0 < height) {
          lVar12 = (long)ref_stride;
          do {
            uVar4 = *(undefined8 *)(ref + lVar12);
            uVar5 = *(undefined8 *)(ref + lVar12 * 2);
            uVar6 = *(undefined8 *)(ref + lVar12 * 3);
            *(int *)comp_pred = (int)*(undefined8 *)ref;
            *(int *)(comp_pred + 4) = (int)uVar4;
            *(int *)(comp_pred + 8) = (int)uVar5;
            *(int *)(comp_pred + 0xc) = (int)uVar6;
            comp_pred = comp_pred + 0x10;
            ref = ref + (ref_stride << 2);
            height = height + -1;
          } while (height != 0);
        }
      }
      else if (0 < height) {
        lVar12 = 0;
        do {
          uVar4 = *(undefined8 *)(ref + ref_stride);
          uVar8 = *(undefined4 *)(ref + 4);
          puVar1 = comp_pred + lVar12 * 8;
          *(undefined4 *)puVar1 = *(undefined4 *)ref;
          *(undefined4 *)(puVar1 + 4) = uVar8;
          *(int *)(puVar1 + 8) = (int)uVar4;
          *(int *)(puVar1 + 0xc) = (int)((ulong)uVar4 >> 0x20);
          ref = ref + ref_stride * 2;
          lVar12 = lVar12 + 2;
        } while ((int)lVar12 < height);
      }
    }
    else if (0 < height) {
      iVar10 = 0;
      do {
        lVar12 = 0;
        do {
          uVar4 = *(undefined8 *)(ref + lVar12 + 8);
          *(undefined8 *)(comp_pred + lVar12) = *(undefined8 *)(ref + lVar12);
          *(undefined8 *)(comp_pred + lVar12 + 8) = uVar4;
          lVar12 = lVar12 + 0x10;
        } while ((int)lVar12 < width);
        ref = ref + lVar12 + (ref_stride - width);
        iVar10 = iVar10 + 1;
        comp_pred = comp_pred + lVar12;
      } while (iVar10 != height);
    }
  }
  else if (subpel_y_q3 == 0) {
    uStackY_9080 = 0x25200a;
    (*aom_convolve8_horiz)
              (ref,(long)ref_stride,comp_pred,(long)width,
               (int16_t *)((long)(subpel_x_q3 * 2) * (ulong)*(ushort *)(plVar11 + 1) * 2 + *plVar11)
               ,0x10,(int16_t *)0x0,-1,width,height);
  }
  else if (subpel_x_q3 == 0) {
    uStackY_9080 = 0x252080;
    (*aom_convolve8_vert)
              (ref,(long)ref_stride,comp_pred,(long)width,(int16_t *)0x0,-1,
               (int16_t *)((long)(subpel_y_q3 * 2) * (ulong)*(ushort *)(plVar11 + 1) * 2 + *plVar11)
               ,0x10,width,height);
  }
  else {
    uVar14 = (uint)(2 < subpel_search) * 4 + 4;
    lVar12 = *plVar11;
    uVar7 = *(ushort *)(plVar11 + 1);
    uStackY_9080 = 0x251f63;
    (*aom_convolve8_horiz)
              (ref + -(long)(int)(((uVar14 >> 1) - 1) * ref_stride),(long)ref_stride,
               temp + (ulong)(subpel_search < 3) * 0x100,0x80,
               (int16_t *)(lVar12 + (long)(subpel_x_q3 * 2) * (ulong)uVar7 * 2),0x10,(int16_t *)0x0,
               -1,width,(subpel_y_q3 + height * 8 + -8 >> 3) + uVar14);
    uStackY_9080 = 0x251f8f;
    (*aom_convolve8_vert)
              (auStackY_90b8 + ((uVar7 & 0x3fffffe) << 6),0x80,comp_pred,(long)width,(int16_t *)0x0,
               -1,(int16_t *)(lVar12 + (long)(subpel_y_q3 * 2) * (ulong)uVar7 * 2),0x10,width,height
              );
  }
  return;
}

Assistant:

void aom_upsampled_pred_sse2(MACROBLOCKD *xd, const struct AV1Common *const cm,
                             int mi_row, int mi_col, const MV *const mv,
                             uint8_t *comp_pred, int width, int height,
                             int subpel_x_q3, int subpel_y_q3,
                             const uint8_t *ref, int ref_stride,
                             int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);
  // (TODO:yunqing) 2-tap case uses 4-tap functions since there is no SIMD for
  // 2-tap yet.
  int filter_taps = (subpel_search <= USE_4_TAPS) ? 4 : SUBPEL_TAPS;

  if (!subpel_x_q3 && !subpel_y_q3) {
    if (width >= 16) {
      int i;
      assert(!(width & 15));
      /*Read 16 pixels one row at a time.*/
      for (i = 0; i < height; i++) {
        int j;
        for (j = 0; j < width; j += 16) {
          xx_storeu_128(comp_pred, xx_loadu_128(ref));
          comp_pred += 16;
          ref += 16;
        }
        ref += ref_stride - width;
      }
    } else if (width >= 8) {
      int i;
      assert(!(width & 7));
      assert(!(height & 1));
      /*Read 8 pixels two rows at a time.*/
      for (i = 0; i < height; i += 2) {
        __m128i s0 = xx_loadl_64(ref + 0 * ref_stride);
        __m128i s1 = xx_loadl_64(ref + 1 * ref_stride);
        xx_storeu_128(comp_pred, _mm_unpacklo_epi64(s0, s1));
        comp_pred += 16;
        ref += 2 * ref_stride;
      }
    } else {
      int i;
      assert(!(width & 3));
      assert(!(height & 3));
      /*Read 4 pixels four rows at a time.*/
      for (i = 0; i < height; i++) {
        const __m128i row0 = xx_loadl_64(ref + 0 * ref_stride);
        const __m128i row1 = xx_loadl_64(ref + 1 * ref_stride);
        const __m128i row2 = xx_loadl_64(ref + 2 * ref_stride);
        const __m128i row3 = xx_loadl_64(ref + 3 * ref_stride);
        const __m128i reg = _mm_unpacklo_epi64(_mm_unpacklo_epi32(row0, row1),
                                               _mm_unpacklo_epi32(row2, row3));
        xx_storeu_128(comp_pred, reg);
        comp_pred += 16;
        ref += 4 * ref_stride;
      }
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_convolve8_horiz(ref, ref_stride, comp_pred, width, kernel, 16, NULL, -1,
                        width, height);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_convolve8_vert(ref, ref_stride, comp_pred, width, NULL, -1, kernel, 16,
                       width, height);
  } else {
    DECLARE_ALIGNED(16, uint8_t,
                    temp[((MAX_SB_SIZE * 2 + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const uint8_t *ref_start = ref - ref_stride * ((filter_taps >> 1) - 1);
    uint8_t *temp_start_horiz = (subpel_search <= USE_4_TAPS)
                                    ? temp + (filter_taps >> 1) * MAX_SB_SIZE
                                    : temp;
    uint8_t *temp_start_vert = temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1);
    int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter_taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_convolve8_horiz(ref_start, ref_stride, temp_start_horiz, MAX_SB_SIZE,
                        kernel_x, 16, NULL, -1, width, intermediate_height);
    aom_convolve8_vert(temp_start_vert, MAX_SB_SIZE, comp_pred, width, NULL, -1,
                       kernel_y, 16, width, height);
  }
}